

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __pid_t _Var1;
  long lVar2;
  string *sess_name;
  int64_t iVar3;
  undefined8 uVar4;
  AgrgumentException *e;
  UtilException *e_1;
  string session_name_2;
  string session_name_1;
  string session_name;
  History history;
  Configurator conf;
  streambuf *output;
  ofstream file;
  WrappedArgsParser wrappedArgs;
  ArgParser args;
  string *in_stack_00002ea8;
  ArgParser *in_stack_00002eb0;
  History *in_stack_ffffffffffffe300;
  string *in_stack_ffffffffffffe308;
  string *in_stack_ffffffffffffe310;
  streambuf *in_stack_ffffffffffffe328;
  allocator *paVar5;
  Configurator *in_stack_ffffffffffffe330;
  string *in_stack_ffffffffffffe338;
  Configurator *in_stack_ffffffffffffe340;
  string *in_stack_ffffffffffffe348;
  History *in_stack_ffffffffffffe350;
  string *in_stack_ffffffffffffe358;
  string *psVar6;
  History *in_stack_ffffffffffffe360;
  string *in_stack_ffffffffffffe368;
  string *session;
  History *this;
  History *in_stack_ffffffffffffe388;
  allocator local_1c61;
  string local_1c60 [32];
  string local_1c40 [32];
  string local_1c20 [32];
  string local_1c00 [32];
  string local_1be0 [32];
  timeval local_1bc0 [2];
  byte local_1b9a;
  allocator local_1b99;
  string local_1b98 [240];
  string *in_stack_ffffffffffffe558;
  History *in_stack_ffffffffffffe560;
  string *in_stack_ffffffffffffe8d0;
  string *in_stack_ffffffffffffe8d8;
  History *in_stack_ffffffffffffe8e0;
  WrappedArgsParser *in_stack_ffffffffffffe8f0;
  char **in_stack_ffffffffffffe970;
  int in_stack_ffffffffffffe97c;
  ArgParser *in_stack_ffffffffffffe980;
  group *in_stack_ffffffffffffeab0;
  string *in_stack_ffffffffffffeab8;
  WrappedArgsParser *in_stack_ffffffffffffeac0;
  string local_ed8 [336];
  undefined8 local_d88;
  string local_d80 [519];
  allocator local_b79;
  string local_b78 [999];
  undefined1 local_791 [33];
  string local_770 [288];
  uint local_650;
  string local_648 [104];
  string local_5e0 [160];
  byte local_540;
  byte local_4f0;
  byte local_4ef;
  byte local_4ee;
  undefined1 local_4e8 [416];
  undefined1 local_348 [32];
  string local_328 [804];
  int local_4;
  
  local_4 = 0;
  this = (History *)local_791;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_791 + 1),"hm-db",(allocator *)this);
  session = local_770;
  psVar6 = (string *)(local_791 + 1);
  ArgParser::ArgParser(in_stack_00002eb0,in_stack_00002ea8);
  std::__cxx11::string::~string(psVar6);
  std::allocator<char>::~allocator((allocator<char> *)local_791);
  ArgParser::parse(in_stack_ffffffffffffe980,in_stack_ffffffffffffe97c,in_stack_ffffffffffffe970);
  if ((local_650 == 4) || (local_650 == 6)) {
    exit(0);
  }
  if (local_650 == 5) {
    paVar5 = &local_b79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b78,"hm",paVar5);
    psVar6 = local_b78;
    WrappedArgsParser::WrappedArgsParser
              (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab0);
    std::__cxx11::string::~string(psVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_b79);
    WrappedArgsParser::print_help(in_stack_ffffffffffffe8f0);
    exit(0);
  }
  if (local_650 != 7) {
    if (((local_650 != 1) || ((local_540 & 1) == 0)) || (_Var1 = fork(), _Var1 == 0)) {
      History::History(in_stack_ffffffffffffe560,in_stack_ffffffffffffe558);
      sess_name = (string *)(ulong)local_650;
      switch(sess_name) {
      case (string *)0x0:
        lVar2 = std::__cxx11::string::length();
        local_1b9a = 0;
        if (lVar2 == 0) {
          paVar5 = &local_1b99;
          std::allocator<char>::allocator();
          local_1b9a = 1;
          std::__cxx11::string::string(local_1b98,"notdefined",paVar5);
        }
        else {
          std::__cxx11::string::string(local_1b98,local_648);
        }
        if ((local_1b9a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_1b99);
        }
        iVar3 = History::insert_sess(in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
        std::ostream::operator<<(&std::cout,iVar3);
        std::__cxx11::string::~string(local_1b98);
        break;
      case (string *)0x1:
        History::insert_cmd(this,session,(string *)psVar6,in_stack_ffffffffffffe368,
                            (string *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
        break;
      case (string *)0x2:
        std::__cxx11::string::string((string *)local_1bc0,(string *)(local_4e8 + 0x20));
        if (((local_4ee & 1) != 0) && (lVar2 = std::__cxx11::string::length(), lVar2 == 0)) {
          History::get_sess_name(in_stack_ffffffffffffe388,(string *)this);
          std::__cxx11::string::operator=((string *)local_1bc0,local_1be0);
          std::__cxx11::string::~string(local_1be0);
        }
        History::select((History *)(local_1b98 + 0x20),local_4f0 & 1,(fd_set *)local_4e8,
                        (fd_set *)(ulong)(local_4ef & 1),(fd_set *)(ulong)(local_4ee & 1),local_1bc0
                       );
        if ((local_4ee & 1) != 0) {
          History::set_sess_name(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348,sess_name);
        }
        std::__cxx11::string::~string((string *)local_1bc0);
        break;
      case (string *)0x3:
        History::parse_input_file
                  (in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8d8,in_stack_ffffffffffffe8d0);
        break;
      default:
        uVar4 = __cxa_allocate_exception(0x28);
        paVar5 = &local_1c61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c60,"unsupported mode",paVar5);
        AgrgumentException::AgrgumentException
                  ((AgrgumentException *)sess_name,in_stack_ffffffffffffe338);
        __cxa_throw(uVar4,&AgrgumentException::typeinfo,AgrgumentException::~AgrgumentException);
      case (string *)0x8:
        History::get_sess_name(in_stack_ffffffffffffe388,(string *)this);
        std::__cxx11::string::string(local_1c20,local_5e0);
        std::__cxx11::string::string(local_1c40,local_1c00);
        print_session_info(in_stack_ffffffffffffe310,in_stack_ffffffffffffe308);
        std::__cxx11::string::~string(local_1c40);
        std::__cxx11::string::~string(local_1c20);
        std::__cxx11::string::~string(local_1c00);
      }
      History::~History(in_stack_ffffffffffffe300);
    }
    local_4 = 0;
    ArgParser::~ArgParser((ArgParser *)in_stack_ffffffffffffe300);
    return local_4;
  }
  std::ofstream::ofstream(local_d80);
  local_d88 = std::ios::rdbuf();
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::ofstream::open(local_d80,(_Ios_Openmode)local_348);
    local_d88 = std::ofstream::rdbuf();
  }
  Configurator::Configurator(in_stack_ffffffffffffe330,in_stack_ffffffffffffe328);
  std::__cxx11::string::string(local_ed8,local_328);
  Configurator::configure(in_stack_ffffffffffffe340,in_stack_ffffffffffffe338);
  std::__cxx11::string::~string(local_ed8);
  exit(0);
}

Assistant:

int main(int argc, char* argv[]) {
  const ArgParser args("hm-db");

  try {
    args.parse(argc, argv);

    if (args.selected == mode::help || args.selected == mode::version) {
      exit(0);
    }

    if (args.selected == mode::wrapped_help) {
      const WrappedArgsParser wrappedArgs("hm", args.select_options);
      wrappedArgs.print_help();
      exit(0);
    }

    if (args.selected == mode::configure) {
      std::ofstream file;
      std::streambuf* output = std::cerr.rdbuf();

      if (args.conffile.length()) {
        file.open(args.conffile, std::ios_base::app);
        output = file.rdbuf();
      }

      Configurator conf(output);
      conf.configure(args.hmhome);
      exit(0);
    }

    if (args.selected == mode::add && args.asynchronous) {
      if (fork() != 0) {
        return 0;
      }
    }

    History history(args.db_path);

    switch (args.selected) {
      case mode::new_session: {
        std::string session_name =
            args.session_name.length() == 0 ? "notdefined" : args.session_name;
        std::cout << history.insert_sess(session_name);
      } break;
      case mode::add:
        history.insert_cmd(args.sess_id, args.datetime, args.cwd, args.cmd,
                           args.ret_code);
        break;
      case mode::parse:
        history.parse_input_file(args.filename, args.separator);
        break;
      case mode::select: {
        std::string session_name = args.selection_session_name;

        if (args.by_sess && session_name.length() == 0)
          session_name = history.get_sess_name(args.sess_id);

        history.select(args.by_dir, args.selection_path, args.recursively,
                       args.by_sess, session_name);

        if (args.by_sess) history.set_sess_name(args.sess_id, session_name);
      } break;
      case mode::info: {
        std::string session_name = history.get_sess_name(args.sess_id);
        print_session_info(args.sess_id, session_name);
      } break;
      default:
        throw AgrgumentException("unsupported mode");
    }
  } catch (const AgrgumentException& e) {
    std::cout << "Error: " << e.what() << std::endl;
    args.print_usage();
    exit(ARG_ERROR);
  } catch (const UtilException& e) {
    std::cout << "Error: " << e.what() << std::endl;
    exit(FAILED_TO_PROCESS);
  }

  return 0;
}